

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readValue(Reader *this)

{
  ulong uVar1;
  Value *pVVar2;
  allocator local_131;
  string local_130;
  undefined1 local_110 [8];
  Value v_3;
  Value v_2;
  Value v_1;
  Value v;
  undefined1 local_68 [7];
  bool successful;
  Token token;
  allocator local_39;
  string local_38;
  Reader *local_18;
  Reader *this_local;
  
  local_18 = this;
  if (999 < stackDepth_g) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"Exceeded stackLimit in readValue().",&local_39);
    throwRuntimeError(&local_38);
  }
  stackDepth_g = stackDepth_g + 1;
  skipCommentTokens(this,(Token *)local_68);
  v.limit_._7_1_ = true;
  if (((this->collectComments_ & 1U) != 0) &&
     (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    pVVar2 = currentValue(this);
    Value::setComment(pVVar2,&this->commentsBefore_,commentBefore);
    std::__cxx11::string::operator=((string *)&this->commentsBefore_,"");
  }
  switch(local_68._0_4_) {
  case 1:
    v.limit_._7_1_ = readObject(this,(Token *)local_68);
    pVVar2 = currentValue(this);
    Value::setOffsetLimit(pVVar2,(long)this->current_ - (long)this->begin_);
    break;
  case 2:
  case 4:
  case 10:
    if (((this->features_).allowDroppedNullPlaceholders_ & 1U) == 0) goto switchD_00111c7f_default;
    this->current_ = this->current_ + -1;
    Value::Value((Value *)local_110,nullValue);
    pVVar2 = currentValue(this);
    Value::swapPayload(pVVar2,(Value *)local_110);
    pVVar2 = currentValue(this);
    Value::setOffsetStart(pVVar2,(ptrdiff_t)(this->current_ + ~(ulong)this->begin_));
    pVVar2 = currentValue(this);
    Value::setOffsetLimit(pVVar2,(long)this->current_ - (long)this->begin_);
    Value::~Value((Value *)local_110);
    break;
  case 3:
    v.limit_._7_1_ = readArray(this,(Token *)local_68);
    pVVar2 = currentValue(this);
    Value::setOffsetLimit(pVVar2,(long)this->current_ - (long)this->begin_);
    break;
  case 5:
    v.limit_._7_1_ = decodeString(this,(Token *)local_68);
    break;
  case 6:
    v.limit_._7_1_ = decodeNumber(this,(Token *)local_68);
    break;
  case 7:
    Value::Value((Value *)&v_1.limit_,true);
    pVVar2 = currentValue(this);
    Value::swapPayload(pVVar2,(Value *)&v_1.limit_);
    pVVar2 = currentValue(this);
    Value::setOffsetStart(pVVar2,token._0_8_ - (long)this->begin_);
    pVVar2 = currentValue(this);
    Value::setOffsetLimit(pVVar2,(long)token.start_ - (long)this->begin_);
    Value::~Value((Value *)&v_1.limit_);
    break;
  case 8:
    Value::Value((Value *)&v_2.limit_,false);
    pVVar2 = currentValue(this);
    Value::swapPayload(pVVar2,(Value *)&v_2.limit_);
    pVVar2 = currentValue(this);
    Value::setOffsetStart(pVVar2,token._0_8_ - (long)this->begin_);
    pVVar2 = currentValue(this);
    Value::setOffsetLimit(pVVar2,(long)token.start_ - (long)this->begin_);
    Value::~Value((Value *)&v_2.limit_);
    break;
  case 9:
    Value::Value((Value *)&v_3.limit_,nullValue);
    pVVar2 = currentValue(this);
    Value::swapPayload(pVVar2,(Value *)&v_3.limit_);
    pVVar2 = currentValue(this);
    Value::setOffsetStart(pVVar2,token._0_8_ - (long)this->begin_);
    pVVar2 = currentValue(this);
    Value::setOffsetLimit(pVVar2,(long)token.start_ - (long)this->begin_);
    Value::~Value((Value *)&v_3.limit_);
    break;
  default:
switchD_00111c7f_default:
    pVVar2 = currentValue(this);
    Value::setOffsetStart(pVVar2,token._0_8_ - (long)this->begin_);
    pVVar2 = currentValue(this);
    Value::setOffsetLimit(pVVar2,(long)token.start_ - (long)this->begin_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_130,"Syntax error: value, object or array expected.",&local_131);
    this_local._7_1_ = addError(this,&local_130,(Token *)local_68,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    goto LAB_00112225;
  }
  if ((this->collectComments_ & 1U) != 0) {
    this->lastValueEnd_ = this->current_;
    pVVar2 = currentValue(this);
    this->lastValue_ = pVVar2;
  }
  stackDepth_g = stackDepth_g + -1;
  this_local._7_1_ = v.limit_._7_1_;
LAB_00112225:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Reader::readValue() {
  // This is a non-reentrant way to support a stackLimit. Terrible!
  // But this deprecated class has a security problem: Bad input can
  // cause a seg-fault. This seems like a fair, binary-compatible way
  // to prevent the problem.
  if (stackDepth_g >= stackLimit_g) throwRuntimeError("Exceeded stackLimit in readValue().");
  ++stackDepth_g;

  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_ = "";
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue:
    {
    Value v(true);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenFalse:
    {
    Value v(false);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenNull:
    {
    Value v;
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenArraySeparator:
  case tokenObjectEnd:
  case tokenArrayEnd:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      Value v;
      currentValue().swapPayload(v);
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    } // Else, fall through...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  --stackDepth_g;
  return successful;
}